

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O3

void __thiscall GNUmakeTokenPool::Clear(GNUmakeTokenPool *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = this->used_;
  while (0 < iVar2) {
    (*(this->super_TokenPool)._vptr_TokenPool[4])(this);
    iVar2 = this->used_;
  }
  iVar2 = this->available_;
  while (1 < iVar2) {
    iVar1 = (*(this->super_TokenPool)._vptr_TokenPool[0xb])(this);
    iVar2 = this->available_;
    if ((char)iVar1 != '\0') {
      iVar2 = iVar2 + -1;
      this->available_ = iVar2;
    }
  }
  return;
}

Assistant:

void GNUmakeTokenPool::Clear() {
  while (used_ > 0)
    Release();
  while (available_ > 1)
    Return();
}